

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  dynbuf *s;
  char cVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  CURLcode CVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  fileinfo *pfVar11;
  char *pcVar12;
  void *pvVar13;
  curlfiletype cVar14;
  size_t __n;
  ulong uVar15;
  ulong uVar16;
  char c;
  char *endptr;
  curl_off_t hlinks;
  byte local_69;
  char *local_68;
  size_t local_60;
  char *local_58;
  Curl_easy *local_50;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  uVar15 = size * nmemb;
  piVar3 = (int *)**(undefined8 **)(*(long *)((long)connptr + 0x13c8) + 0x30);
  local_48 = uVar15;
  if (piVar3[3] == 0) {
    if ((uVar15 != 0) && (*piVar3 == 0)) {
      *piVar3 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    if (uVar15 != 0) {
      local_38 = uVar15 + 1;
      uVar16 = 0;
      local_68 = buffer;
      local_50 = (Curl_easy *)connptr;
      do {
        local_69 = buffer[uVar16];
        if (*(long *)(piVar3 + 4) == 0) {
          pfVar11 = Curl_fileinfo_alloc();
          *(fileinfo **)(piVar3 + 4) = pfVar11;
          if (pfVar11 != (fileinfo *)0x0) {
            piVar3[8] = 0;
            piVar3[9] = 0;
            piVar3[6] = 0;
            Curl_dyn_init(&pfVar11->buf,10000);
            goto LAB_001301b4;
          }
          piVar3[3] = 0x1b;
          iVar8 = 2;
          goto LAB_00130d11;
        }
LAB_001301b4:
        pfVar11 = *(fileinfo **)(piVar3 + 4);
        s = &pfVar11->buf;
        CVar7 = Curl_dyn_addn(s,&local_69,1);
        if (CVar7 != CURLE_OK) {
          piVar3[3] = 0x1b;
          iVar8 = 2;
          buffer = local_68;
          goto LAB_00130d11;
        }
        local_60 = Curl_dyn_len(s);
        pcVar12 = Curl_dyn_ptr(s);
        iVar8 = 2;
        buffer = local_68;
        if (*piVar3 == 2) {
          switch(piVar3[1]) {
          case 0:
            uVar9 = piVar3[6] + 1;
            piVar3[6] = uVar9;
            if (uVar9 < 9) {
              __n = 0xc;
              pcVar12 = "0123456789-";
LAB_0013075a:
              pvVar13 = memchr(pcVar12,(int)(char)local_69,__n);
              if (pvVar13 == (void *)0x0) goto LAB_00130768;
            }
            else {
              if ((uVar9 != 9) || (local_69 != 0x20)) {
                piVar3[3] = 0x57;
                iVar8 = 2;
                goto LAB_00130d11;
              }
              piVar3[1] = 1;
              piVar3[2] = 0;
            }
            break;
          case 1:
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if (piVar3[2] == 1) {
              if (local_69 != 0x20) {
                __n = 0xf;
                pcVar12 = "APM0123456789:";
                goto LAB_0013075a;
              }
              *(long *)(piVar3 + 0x10) = *(long *)(piVar3 + 8);
              pcVar12[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              piVar3[1] = 2;
              piVar3[2] = 0;
LAB_001306ac:
              piVar3[6] = 0;
            }
            else if (((piVar3[2] == 0) && (local_69 != 9)) && (local_69 != 0x20)) goto LAB_001303cd;
            break;
          case 2:
            iVar10 = piVar3[2];
            if (iVar10 != 1) goto LAB_00130645;
            iVar8 = piVar3[6];
            piVar3[6] = iVar8 + 1U;
            if (local_69 == 0x20) {
              pcVar12[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              lVar5 = *(long *)(piVar3 + 8);
              iVar8 = strcmp("<DIR>",pcVar12 + lVar5);
              if (iVar8 == 0) {
                (pfVar11->info).filetype = CURLFILETYPE_DIRECTORY;
                (pfVar11->info).size = 0;
              }
              else {
                local_58 = pcVar12 + lVar5;
                iVar8 = Curl_str_numblanks(&local_58,&(pfVar11->info).size);
                if (iVar8 != 0) {
                  piVar3[3] = 0x57;
                  iVar8 = 2;
                  buffer = local_68;
                  goto LAB_00130d11;
                }
                *(undefined4 *)(*(long *)(piVar3 + 4) + 8) = 0;
              }
              *(uint *)(*(long *)(piVar3 + 4) + 0x60) =
                   *(uint *)(*(long *)(piVar3 + 4) + 0x60) | 0x40;
              piVar3[6] = 0;
              piVar3[1] = 3;
              piVar3[2] = 0;
            }
            break;
          case 3:
            iVar10 = piVar3[2];
            if (iVar10 == 2) {
              if (local_69 != 10) goto LAB_00130768;
              *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
            }
            else {
              if (iVar10 != 1) goto LAB_00130645;
              piVar3[6] = piVar3[6] + 1;
              if (local_69 != 10) {
                if (local_69 == 0xd) {
                  piVar3[2] = 2;
                  pcVar12[local_60 - 1] = '\0';
                }
                break;
              }
              *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
              pcVar12[local_60 - 1] = '\0';
            }
            ftp_pl_insert_finfo(local_50,pfVar11);
            piVar3[1] = 0;
            piVar3[2] = 0;
          }
          goto switchD_00130233_default;
        }
        if (*piVar3 != 1) {
          local_48 = local_38;
          goto LAB_00130d11;
        }
        switch(piVar3[1]) {
        case 0:
          if (piVar3[2] == 1) {
            uVar9 = piVar3[6];
            piVar3[6] = uVar9 + 1;
            if (local_69 == 10) {
              pcVar12[uVar9] = '\0';
              iVar10 = strncmp("total ",pcVar12,6);
              if (iVar10 != 0) goto LAB_00130768;
              local_58 = pcVar12 + 6;
              Curl_str_passblanks(&local_58);
              cVar2 = *local_58;
              while ((byte)(cVar2 - 0x30U) < 10) {
                local_58 = local_58 + 1;
                cVar2 = *local_58;
              }
              if (cVar2 != '\0') {
                piVar3[3] = 0x57;
                iVar8 = 2;
                buffer = local_68;
                goto LAB_00130d11;
              }
              piVar3[1] = 1;
              Curl_dyn_reset(s);
            }
            else if (local_69 == 0xd) {
              piVar3[6] = uVar9;
              Curl_dyn_setlen(s,local_60 - 1);
            }
          }
          else if (piVar3[2] == 0) {
            if (local_69 != 0x74) {
              piVar3[1] = 1;
              Curl_dyn_reset(s);
              iVar8 = 3;
              buffer = local_68;
              goto LAB_00130d11;
            }
            piVar3[2] = 1;
            piVar3[6] = piVar3[6] + 1;
          }
          break;
        case 1:
          if (local_69 < 100) {
            if (local_69 < 0x62) {
              cVar14 = CURLFILETYPE_FILE;
              if (local_69 != 0x2d) {
                if (local_69 != 0x44) goto LAB_00130768;
                cVar14 = CURLFILETYPE_DOOR;
              }
            }
            else if (local_69 == 0x62) {
              cVar14 = CURLFILETYPE_DEVICE_BLOCK;
            }
            else {
              if (local_69 != 99) goto LAB_00130768;
              cVar14 = CURLFILETYPE_DEVICE_CHAR;
            }
          }
          else if (local_69 < 0x70) {
            if (local_69 == 100) {
              cVar14 = CURLFILETYPE_DIRECTORY;
            }
            else {
              if (local_69 != 0x6c) goto LAB_00130768;
              cVar14 = CURLFILETYPE_SYMLINK;
            }
          }
          else if (local_69 == 0x70) {
            cVar14 = CURLFILETYPE_NAMEDPIPE;
          }
          else {
            if (local_69 != 0x73) goto LAB_00130768;
            cVar14 = CURLFILETYPE_SOCKET;
          }
          (pfVar11->info).filetype = cVar14;
          piVar3[1] = 2;
          piVar3[6] = 0;
          piVar3[8] = 1;
          piVar3[9] = 0;
          break;
        case 2:
          uVar9 = piVar3[6] + 1;
          piVar3[6] = uVar9;
          if (uVar9 < 10) {
            __n = 9;
            pcVar12 = "rwx-tTsS";
            goto LAB_0013075a;
          }
          if (uVar9 != 10) break;
          if (local_69 == 0x20) {
            pcVar12[10] = '\0';
            lVar5 = *(long *)(piVar3 + 8);
            uVar9 = ftp_pl_get_permission(pcVar12 + lVar5);
            if (0xffffff < uVar9) {
              piVar3[3] = 0x57;
              goto LAB_00130caf;
            }
            lVar4 = *(long *)(piVar3 + 4);
            puVar1 = (uint *)(lVar4 + 0x60);
            *puVar1 = *puVar1 | 8;
            *(uint *)(lVar4 + 0x18) = uVar9;
            *(long *)(piVar3 + 0x12) = lVar5;
            piVar3[6] = 0;
            piVar3[1] = 3;
            piVar3[2] = 0;
            iVar8 = 0;
            bVar6 = true;
          }
          else {
            piVar3[3] = 0x57;
LAB_00130caf:
            iVar8 = 2;
            bVar6 = false;
          }
          buffer = local_68;
          if (!bVar6) goto LAB_00130d11;
          break;
        case 3:
          iVar10 = piVar3[2];
          if (iVar10 == 1) {
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if (local_69 == 0x20) {
              local_58 = pcVar12 + *(long *)(piVar3 + 8);
              local_58[(ulong)(iVar10 + 1U) - 1] = '\0';
              iVar8 = Curl_str_number(&local_58,&local_40,0x7fffffffffffffff);
              if (iVar8 == 0) {
                lVar5 = *(long *)(piVar3 + 4);
                puVar1 = (uint *)(lVar5 + 0x60);
                *puVar1 = *puVar1 | 0x80;
                *(long *)(lVar5 + 0x30) = local_40;
              }
              piVar3[6] = 0;
              piVar3[8] = 0;
              piVar3[9] = 0;
              piVar3[1] = 4;
              piVar3[2] = 0;
            }
            else {
LAB_0013083d:
              if (9 < (byte)(local_69 - 0x30)) goto LAB_00130768;
            }
          }
          else {
LAB_00130610:
            if ((iVar10 == 0) && (local_69 != 0x20)) {
              if ((byte)(local_69 - 0x30) < 10) goto LAB_00130658;
              goto LAB_00130768;
            }
          }
          break;
        case 4:
          iVar10 = piVar3[2];
          if (iVar10 == 1) {
            iVar8 = piVar3[6];
            piVar3[6] = iVar8 + 1U;
            if (local_69 == 0x20) {
              pcVar12[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              *(undefined8 *)(piVar3 + 0xc) = *(undefined8 *)(piVar3 + 8);
              piVar3[1] = 5;
              piVar3[2] = 0;
LAB_001305f6:
              piVar3[8] = 0;
              piVar3[9] = 0;
              goto LAB_001306ac;
            }
          }
          else {
LAB_00130645:
            if (iVar10 == 0) goto switchD_00130461_caseD_0;
          }
          break;
        case 5:
          iVar10 = piVar3[2];
          if (iVar10 != 1) goto LAB_00130645;
          iVar8 = piVar3[6];
          piVar3[6] = iVar8 + 1U;
          if (local_69 == 0x20) {
            pcVar12[((ulong)(iVar8 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 0xe) = *(undefined8 *)(piVar3 + 8);
            piVar3[1] = 6;
            piVar3[2] = 0;
            goto LAB_001305f6;
          }
          break;
        case 6:
          iVar10 = piVar3[2];
          if (iVar10 != 1) goto LAB_00130610;
          iVar10 = piVar3[6];
          piVar3[6] = iVar10 + 1U;
          if (local_69 != 0x20) goto LAB_0013083d;
          local_58 = pcVar12 + *(long *)(piVar3 + 8);
          local_58[(ulong)(iVar10 + 1U) - 1] = '\0';
          iVar8 = Curl_str_numblanks(&local_58,&local_40);
          if (iVar8 == 0) {
            if (local_40 != 0x7fffffffffffffff && *local_58 == '\0') {
              lVar5 = *(long *)(piVar3 + 4);
              puVar1 = (uint *)(lVar5 + 0x60);
              *puVar1 = *puVar1 | 0x40;
              *(long *)(lVar5 + 0x28) = local_40;
            }
            piVar3[6] = 0;
            piVar3[8] = 0;
            piVar3[9] = 0;
            piVar3[1] = 7;
            piVar3[2] = 0;
          }
          break;
        case 7:
          switch(piVar3[2]) {
          case 0:
            if (local_69 != 0x20) {
              if ((9 < (byte)(local_69 - 0x30)) && (0x19 < (byte)((local_69 & 0xdf) + 0xbf)))
              goto LAB_00130768;
              goto LAB_00130658;
            }
            break;
          case 1:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 == 0x20) {
LAB_00130984:
              piVar3[2] = 2;
            }
            else {
LAB_00130991:
              if ((0x19 < (byte)(local_69 + 0x9f) && 9 < (byte)(local_69 - 0x30)) &&
                 (local_69 != 0x2e && (byte)(local_69 + 0xa5) < 0xe6)) goto LAB_00130768;
            }
            break;
          case 2:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 != 0x20) {
              if ((9 < (byte)(local_69 - 0x30)) && (0x19 < (byte)((local_69 & 0xdf) + 0xbf)))
              goto LAB_00130768;
LAB_00130aad:
              piVar3[2] = 3;
            }
            break;
          case 3:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 != 0x20) goto LAB_00130991;
LAB_00130ade:
            piVar3[2] = 4;
            break;
          case 4:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 != 0x20) {
              if ((9 < (byte)(local_69 - 0x30)) && (0x19 < (byte)((local_69 & 0xdf) + 0xbf)))
              goto LAB_00130768;
              piVar3[2] = 5;
            }
            break;
          case 5:
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if (local_69 == 0x20) {
              pcVar12[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              *(undefined8 *)(piVar3 + 0x10) = *(undefined8 *)(piVar3 + 8);
              if ((pfVar11->info).filetype == CURLFILETYPE_SYMLINK) {
                piVar3[1] = 9;
                piVar3[2] = 0;
              }
              else {
                piVar3[1] = 8;
                piVar3[2] = 0;
              }
            }
            else if (((((byte)(local_69 - 0x3a) < 0xf6) && ((byte)((local_69 & 0xdf) + 0xa5) < 0xe6)
                      ) && (local_69 != 0x2e)) && (local_69 != 0x3a)) goto LAB_00130768;
          }
          break;
        case 8:
          iVar10 = piVar3[2];
          if (iVar10 == 2) {
            if (local_69 != 10) goto LAB_00130768;
            uVar9 = piVar3[6];
          }
          else {
            if (iVar10 != 1) goto LAB_00130645;
            uVar9 = piVar3[6] + 1;
            piVar3[6] = uVar9;
            if (local_69 != 10) {
              if (local_69 == 0xd) goto LAB_00130984;
              break;
            }
          }
          pcVar12[((ulong)uVar9 - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
          piVar3[1] = 1;
          ftp_pl_insert_finfo(local_50,pfVar11);
          break;
        case 9:
          switch(piVar3[2]) {
          case 0:
switchD_00130461_caseD_0:
            if (local_69 != 0x20) {
LAB_00130658:
              *(size_t *)(piVar3 + 8) = local_60 - 1;
              piVar3[6] = 1;
              piVar3[2] = 1;
            }
            break;
          case 1:
            piVar3[6] = piVar3[6] + 1;
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_00130768;
            if (local_69 == 0x20) goto LAB_00130984;
            break;
          case 2:
            piVar3[6] = piVar3[6] + 1;
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_00130768;
            if (local_69 == 0x2d) goto LAB_00130aad;
LAB_001303cd:
            piVar3[2] = 1;
            break;
          case 3:
            piVar3[6] = piVar3[6] + 1;
            if ((local_69 != 10) && (local_69 != 0xd)) {
              if (local_69 == 0x3e) goto LAB_00130ade;
              goto LAB_001303cd;
            }
            goto LAB_00130768;
          case 4:
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_00130768;
            if (local_69 != 0x20) goto LAB_001303cd;
            piVar3[2] = 5;
            pcVar12[((ulong)(iVar10 + 1U) - 4) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
            piVar3[6] = 0;
            piVar3[8] = 0;
            piVar3[9] = 0;
            break;
          case 5:
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_00130768;
            piVar3[2] = 6;
            *(size_t *)(piVar3 + 8) = local_60 - 1;
            piVar3[6] = 1;
            break;
          case 6:
            uVar9 = piVar3[6] + 1;
            piVar3[6] = uVar9;
            if (local_69 == 10) {
LAB_00130cb9:
              pcVar12[((ulong)uVar9 - 1) + *(long *)(piVar3 + 8)] = '\0';
              *(undefined8 *)(piVar3 + 0x14) = *(undefined8 *)(piVar3 + 8);
              ftp_pl_insert_finfo(local_50,pfVar11);
              piVar3[1] = 1;
            }
            else if (local_69 == 0xd) {
              piVar3[2] = 7;
            }
            break;
          case 7:
            if (local_69 == 10) {
              uVar9 = piVar3[6];
              goto LAB_00130cb9;
            }
LAB_00130768:
            piVar3[3] = 0x57;
            buffer = local_68;
            goto LAB_00130d11;
          }
        }
switchD_00130233_default:
        uVar16 = uVar16 + 1;
        iVar8 = 0;
        buffer = local_68;
LAB_00130d11:
        if ((iVar8 != 0) && (iVar8 != 3)) {
          if (iVar8 != 2) {
            return local_48;
          }
          goto LAB_00130110;
        }
      } while (uVar16 < uVar15);
    }
  }
  else {
LAB_00130110:
    if (*(fileinfo **)(piVar3 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar3 + 4));
      piVar3[4] = 0;
      piVar3[5] = 0;
    }
  }
  return local_48;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard->ftpwc;
  struct ftp_parselist_data *parser = ftpwc->parser;
  size_t i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is handled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = ISDIGIT(buffer[0]) ? OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */
    char *mem;
    size_t len; /* number of bytes of data in the dynbuf */
    char c = buffer[i];
    struct fileinfo *infop;
    struct curl_fileinfo *finfo;
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->item_offset = 0;
      parser->item_length = 0;
      Curl_dyn_init(&parser->file_data->buf, MAX_FTPLIST_BUFFER);
    }

    infop = parser->file_data;
    finfo = &infop->info;

    if(Curl_dyn_addn(&infop->buf, &c, 1)) {
      parser->error = CURLE_OUT_OF_MEMORY;
      goto fail;
    }
    len = Curl_dyn_len(&infop->buf);
    mem = Curl_dyn_ptr(&infop->buf);

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            Curl_dyn_reset(&infop->buf);
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            Curl_dyn_setlen(&infop->buf, --len);
          }
          else if(c == '\n') {
            mem[parser->item_length - 1] = 0;
            if(!strncmp("total ", mem, 6)) {
              const char *endptr = mem + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              Curl_str_passblanks(&endptr);
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              Curl_dyn_reset(&infop->buf);
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          mem[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(mem + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            const char *p = &mem[parser->item_offset];
            curl_off_t hlinks;
            mem[parser->item_offset + parser->item_length - 1] = 0;

            if(!Curl_str_number(&p, &hlinks, LONG_MAX)) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = (long)hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            const char *p = mem + parser->item_offset;
            curl_off_t fsize;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(!Curl_str_numblanks(&p, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = len -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->mem + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            mem[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = len - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", mem + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              const char *p = mem + parser->item_offset;
              if(Curl_str_numblanks(&p, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            mem[len - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            mem[len - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}